

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngvalid.c
# Opt level: O1

void make_size(png_store *ps,png_byte colour_type,int bdlo,int bdhi)

{
  undefined8 in_RAX;
  png_store *ps_00;
  png_byte colour_type_00;
  undefined7 in_register_00000031;
  png_uint_32 width;
  int interlace_type;
  png_uint_32 height;
  png_uint_32 w;
  int iVar1;
  ulong uVar2;
  
  if ((int)CONCAT71(in_register_00000031,colour_type) <= bdlo) {
    uVar2 = CONCAT71(in_register_00000031,colour_type) & 0xffffffff;
    ps_00 = (png_store *)((ulong)ps & 0xff);
    do {
      iVar1 = (int)uVar2;
      interlace_type = 1;
      do {
        w = 1;
        do {
          colour_type_00 = (png_byte)(1 << ((byte)uVar2 & 0x1f));
          make_size_image(ps_00,colour_type_00,'\0',interlace_type,w,0,(int)in_RAX);
          make_size_image(ps_00,colour_type_00,'\0',interlace_type,w,1,(int)in_RAX);
          make_size_image(ps_00,colour_type_00,'\x01',interlace_type,w,0,(int)in_RAX);
          make_size_image(ps_00,colour_type_00,'\x01',interlace_type,w,1,(int)in_RAX);
          w = w + 1;
        } while (w != 0x11);
        interlace_type = interlace_type + 1;
      } while (interlace_type != 0x11);
      uVar2 = (ulong)(iVar1 + 1);
    } while (iVar1 != bdlo);
  }
  return;
}

Assistant:

static void
make_size(png_store* const ps, png_byte const colour_type, int bdlo,
    int const bdhi)
{
   for (; bdlo <= bdhi; ++bdlo)
   {
      png_uint_32 width;

      for (width = 1; width <= 16; ++width)
      {
         png_uint_32 height;

         for (height = 1; height <= 16; ++height)
         {
            /* The four combinations of DIY interlace and interlace or not -
             * no interlace + DIY should be identical to no interlace with
             * libpng doing it.
             */
            make_size_image(ps, colour_type, DEPTH(bdlo), PNG_INTERLACE_NONE,
               width, height, 0);
            make_size_image(ps, colour_type, DEPTH(bdlo), PNG_INTERLACE_NONE,
               width, height, 1);
#        ifdef PNG_WRITE_INTERLACING_SUPPORTED
            make_size_image(ps, colour_type, DEPTH(bdlo), PNG_INTERLACE_ADAM7,
               width, height, 0);
#        endif
#        if CAN_WRITE_INTERLACE
            /* 1.7.0 removes the hack that prevented app write of an interlaced
             * image if WRITE_INTERLACE was not supported
             */
            make_size_image(ps, colour_type, DEPTH(bdlo), PNG_INTERLACE_ADAM7,
               width, height, 1);
#        endif
         }
      }
   }
}